

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall
sznet::net::Connector::Connector(Connector *this,EventLoop *loop,InetAddress *serverAddr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  self *this_00;
  LogStream *this_01;
  undefined1 auVar4 [24];
  SourceFile file;
  Logger local_1000;
  undefined1 local_30 [12];
  
  (this->super_enable_shared_from_this<sznet::net::Connector>)._M_weak_this.
  super___weak_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<sznet::net::Connector>)._M_weak_this.
  super___weak_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_loop = loop;
  uVar1 = *(undefined8 *)((long)&serverAddr->field_0 + 8);
  uVar2 = *(undefined8 *)((long)&serverAddr->field_0 + 0xc);
  uVar3 = *(undefined8 *)((long)&serverAddr->field_0 + 0x14);
  *(undefined8 *)&(this->m_serverAddr).field_0 = *(undefined8 *)&serverAddr->field_0;
  *(undefined8 *)((long)&(this->m_serverAddr).field_0 + 8) = uVar1;
  *(undefined8 *)((long)&(this->m_serverAddr).field_0 + 0xc) = uVar2;
  *(undefined8 *)((long)&(this->m_serverAddr).field_0 + 0x14) = uVar3;
  this->m_connect = false;
  this->m_state = kDisconnected;
  (this->m_newConnectionCallback)._M_invoker = (_Invoker_type)0x0;
  auVar4 = SUB3224(ZEXT832(0) << 0x20,8);
  this->m_channel =
       (unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>)
       SUB328(ZEXT832(0) << 0x20,0);
  (this->m_newConnectionCallback).super__Function_base._M_functor = (_Any_data)auVar4._0_16_;
  (this->m_newConnectionCallback).super__Function_base._M_manager = (_Manager_type)auVar4._16_8_;
  this->m_retryDelayMs = 500;
  if (g_logLevel < 2) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_30,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_30._0_8_;
    file.m_size = local_30._8_4_;
    Logger::Logger(&local_1000,file,0x19,DEBUG,"Connector");
    this_00 = LogStream::operator<<(&local_1000.m_impl.m_stream,"ctor[");
    this_01 = LogStream::operator<<(this_00,this);
    LogStream::operator<<(this_01,"]");
    Logger::~Logger(&local_1000);
  }
  return;
}

Assistant:

Connector::Connector(EventLoop* loop, const InetAddress& serverAddr): 
	m_loop(loop),
	m_serverAddr(serverAddr),
	m_connect(false),
	m_state(kDisconnected),
	m_retryDelayMs(kInitRetryDelayMs)
{
	LOG_DEBUG << "ctor[" << this << "]";
}